

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O1

Gia_Man_t * Gia_ManStgOneHot(Vec_Int_t *vLines,int nIns,int nOuts,int nStates)

{
  Gia_Obj_t *pGVar1;
  void *pvVar2;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *p_01;
  Vec_Vec_t *p_02;
  void **ppvVar6;
  undefined8 *puVar7;
  Vec_Vec_t *p_03;
  long lVar8;
  Gia_Man_t *p_04;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint local_70;
  
  if ((vLines->nSize & 3) != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x143,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
  }
  p = Gia_ManStart(10000);
  pcVar3 = (char *)malloc(4);
  builtin_strncpy(pcVar3,"stg",4);
  p->pName = pcVar3;
  iVar11 = nStates + nIns;
  if (iVar11 != 0 && SCARRY4(nStates,nIns) == iVar11 < 0) {
    do {
      pGVar4 = Gia_ManAppendObj(p);
      uVar14 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar4 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p->pObjs;
      if ((pGVar4 < pGVar1) || (pGVar1 + p->nObjs <= pGVar4)) {
LAB_007d59b8:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2) * -0x55555555);
      if ((pGVar4 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar4)) goto LAB_007d59b8;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  Gia_ManHashAlloc(p);
  uVar12 = 1 << ((byte)nIns & 0x1f);
  p_00 = (Vec_Int_t *)malloc(0x10);
  uVar10 = 0x10;
  if (0x10 < uVar12) {
    uVar10 = uVar12;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar10;
  piVar5 = (int *)malloc((long)(int)uVar10 << 2);
  p_00->pArray = piVar5;
  if (nIns != 0x1f) {
    local_70 = 1;
    if (1 < (int)uVar12) {
      local_70 = uVar12;
    }
    uVar10 = 0;
    do {
      if (nIns < 1) {
        iVar11 = 1;
      }
      else {
        iVar11 = 1;
        iVar13 = 2;
        uVar9 = 0;
        do {
          uVar15 = uVar9 + 1;
          iVar11 = Gia_ManHashAnd(p,iVar11,iVar13 + (uint)((~uVar10 >> (uVar9 & 0x1f) & 1) != 0));
          iVar13 = iVar13 + 2;
          uVar9 = uVar15;
        } while (nIns != uVar15);
      }
      Vec_IntPush(p_00,iVar11);
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_70);
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < nStates - 1U) {
    iVar11 = nStates;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar11;
  if (iVar11 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar11 << 2);
  }
  p_01->pArray = piVar5;
  if (0 < nStates) {
    iVar11 = nIns * 2;
    iVar13 = 0;
    do {
      iVar11 = iVar11 + 2;
      if (nIns + 1 + iVar13 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_01,iVar11 + (uint)(iVar13 == 0));
      iVar13 = iVar13 + 1;
    } while (nStates != iVar13);
  }
  p_02 = (Vec_Vec_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < nStates - 1U) {
    iVar11 = nStates;
  }
  p_02->nSize = 0;
  p_02->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar11 << 3);
  }
  p_02->pArray = ppvVar6;
  if (0 < nStates) {
    uVar14 = 0;
    do {
      puVar7 = (undefined8 *)malloc(0x10);
      *puVar7 = 0;
      puVar7[1] = 0;
      ppvVar6[uVar14] = puVar7;
      uVar14 = uVar14 + 1;
    } while ((uint)nStates != uVar14);
  }
  p_02->nSize = nStates;
  p_03 = (Vec_Vec_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < nOuts - 1U) {
    iVar11 = nOuts;
  }
  p_03->nSize = 0;
  p_03->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar11 << 3);
  }
  p_03->pArray = ppvVar6;
  if (0 < nOuts) {
    uVar14 = 0;
    do {
      puVar7 = (undefined8 *)malloc(0x10);
      *puVar7 = 0;
      puVar7[1] = 0;
      ppvVar6[uVar14] = puVar7;
      uVar14 = uVar14 + 1;
    } while ((uint)nOuts != uVar14);
  }
  p_03->nSize = nOuts;
  iVar11 = vLines->nSize;
  if (0 < iVar11) {
    uVar14 = 0;
    do {
      lVar8 = (long)iVar11;
      if (((lVar8 <= (long)(uVar14 | 1)) || (lVar8 <= (long)(uVar14 | 2))) ||
         (lVar8 <= (long)(uVar14 | 3))) {
LAB_007d5999:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = vLines->pArray;
      uVar10 = piVar5[uVar14];
      if (((int)uVar10 < 0) || ((int)uVar12 <= (int)uVar10)) {
        __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x163,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      uVar9 = piVar5[uVar14 | 1];
      if (((int)uVar9 < 1) || (nStates < (int)uVar9)) {
        __assert_fail("iCur >= 0 && iCur < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x164,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      iVar11 = piVar5[uVar14 | 2];
      if ((iVar11 < 1) || (nStates < iVar11)) {
        __assert_fail("iNext >= 0 && iNext < nStates",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x165,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      uVar15 = piVar5[uVar14 | 3];
      if (((int)uVar15 < 0) || (1 << ((byte)nOuts & 0x1f) <= (int)uVar15)) {
        __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                      ,0x166,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
      }
      if (((p_00->nSize <= (int)uVar10) || ((int)uVar9 < 1)) || (p_01->nSize < (int)uVar9))
      goto LAB_007d5999;
      iVar13 = Gia_ManHashAnd(p,p_00->pArray[uVar10],p_01->pArray[(ulong)uVar9 - 1]);
      Vec_VecPushInt(p_02,iVar11 + -1,iVar13);
      if (0 < nOuts) {
        uVar10 = 0;
        do {
          if ((uVar15 >> (uVar10 & 0x1f) & 1) != 0) {
            Vec_VecPushInt(p_03,uVar10,iVar13);
          }
          uVar10 = uVar10 + 1;
        } while (nOuts != uVar10);
      }
      uVar14 = uVar14 + 4;
      iVar11 = vLines->nSize;
    } while ((int)uVar14 < iVar11);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  iVar11 = p_03->nSize;
  lVar8 = (long)iVar11;
  if (0 < lVar8) {
    ppvVar6 = p_03->pArray;
    lVar16 = 0;
    do {
      iVar13 = Gia_ManCreateOrGate(p,(Vec_Int_t *)ppvVar6[lVar16]);
      Gia_ManAppendCo(p,iVar13);
      lVar16 = lVar16 + 1;
    } while (lVar8 != lVar16);
  }
  if (0 < iVar11) {
    ppvVar6 = p_03->pArray;
    lVar16 = 0;
    do {
      pvVar2 = ppvVar6[lVar16];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar16 = lVar16 + 1;
    } while (lVar8 != lVar16);
  }
  if (p_03->pArray != (void **)0x0) {
    free(p_03->pArray);
    p_03->pArray = (void **)0x0;
  }
  free(p_03);
  iVar11 = p_02->nSize;
  lVar8 = (long)iVar11;
  if (0 < lVar8) {
    ppvVar6 = p_02->pArray;
    lVar16 = 0;
    do {
      uVar10 = Gia_ManCreateOrGate(p,(Vec_Int_t *)ppvVar6[lVar16]);
      if ((int)uVar10 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p,uVar10 ^ lVar16 == 0);
      lVar16 = lVar16 + 1;
    } while (lVar8 != lVar16);
  }
  if (0 < iVar11) {
    ppvVar6 = p_02->pArray;
    lVar16 = 0;
    do {
      pvVar2 = ppvVar6[lVar16];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar16 = lVar16 + 1;
    } while (lVar8 != lVar16);
  }
  if (p_02->pArray != (void **)0x0) {
    free(p_02->pArray);
    p_02->pArray = (void **)0x0;
  }
  free(p_02);
  Gia_ManSetRegNum(p,nStates);
  Gia_ManHashStop(p);
  p_04 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  iVar11 = Gia_ManHasDangling(p_04);
  if (iVar11 != 0) {
    __assert_fail("!Gia_ManHasDangling(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x188,"Gia_Man_t *Gia_ManStgOneHot(Vec_Int_t *, int, int, int)");
  }
  return p_04;
}

Assistant:

Gia_Man_t * Gia_ManStgOneHot( Vec_Int_t * vLines, int nIns, int nOuts, int nStates )
{
    Gia_Man_t * p, * pTemp;
    Vec_Int_t * vInMints, * vCurs, * vVec;
    Vec_Vec_t * vLitsNext, * vLitsOuts;
    int i, b, LitC, Lit;
    assert( Vec_IntSize(vLines) % 4 == 0 );

    // start manager
    p = Gia_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( "stg" );
    for ( i = 0; i < nIns + nStates; i++ )
        Gia_ManAppendCi(p);

    // create input minterms
    Gia_ManHashAlloc( p );
    vInMints = Vec_IntAlloc( 1 << nIns );
    for ( i = 0; i < (1 << nIns); i++ )
    {
        for ( Lit = 1, b = 0; b < nIns; b++ )
            Lit = Gia_ManHashAnd( p, Lit, Abc_Var2Lit( b+1, !((i >> b) & 1) ) );
        Vec_IntPush( vInMints, Lit );
    } 

    // create current states
    vCurs  = Vec_IntAlloc( nStates );
    for ( i = 0; i < nStates; i++ )
        Vec_IntPush( vCurs, Abc_Var2Lit( 1+nIns+i, !i ) );

    // go through the lines
    vLitsNext = Vec_VecStart( nStates );
    vLitsOuts = Vec_VecStart( nOuts );
    for ( i = 0; i < Vec_IntSize(vLines); )
    {
        int iMint = Vec_IntEntry(vLines, i++);
        int iCur  = Vec_IntEntry(vLines, i++) - 1;
        int iNext = Vec_IntEntry(vLines, i++) - 1;
        int iOut  = Vec_IntEntry(vLines, i++);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        // create condition
        LitC = Gia_ManHashAnd( p, Vec_IntEntry(vInMints, iMint), Vec_IntEntry(vCurs, iCur) );
        // update next state
//        Lit = Gia_ManHashOr( p, LitC, Vec_IntEntry(vNexts, iNext) );
//        Vec_IntWriteEntry( vNexts, iNext, Lit );
        Vec_VecPushInt( vLitsNext, iNext, LitC );
        // update outputs
        for ( b = 0; b < nOuts; b++ )
            if ( (iOut >> b) & 1 ) 
            {
//                Lit = Gia_ManHashOr( p, LitC, Vec_IntEntry(vOuts, b) );
//                Vec_IntWriteEntry( vOuts, b, Lit );
                Vec_VecPushInt( vLitsOuts, b, LitC );
            }
    }
    Vec_IntFree( vInMints );
    Vec_IntFree( vCurs );

    // create POs
    Vec_VecForEachLevelInt( vLitsOuts, vVec, i )
        Gia_ManAppendCo( p, Gia_ManCreateOrGate(p, vVec) );
    Vec_VecFree( vLitsOuts );

    // create next states
    Vec_VecForEachLevelInt( vLitsNext, vVec, i )
        Gia_ManAppendCo( p, Abc_LitNotCond( Gia_ManCreateOrGate(p, vVec), !i ) );
    Vec_VecFree( vLitsNext );

    Gia_ManSetRegNum( p, nStates );
    Gia_ManHashStop( p );

    p = Gia_ManCleanup( pTemp = p );
    Gia_ManStop( pTemp );
    assert( !Gia_ManHasDangling(p) );
    return p;
}